

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O1

void logpost(void *object,int level,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [1000];
  undefined8 local_4d8;
  void **local_4d0;
  undefined1 *local_4c8;
  undefined1 local_4b8 [24];
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 local_418;
  char local_408 [1008];
  
  if (in_AL != '\0') {
    local_488 = in_XMM0_Qa;
    local_478 = in_XMM1_Qa;
    local_468 = in_XMM2_Qa;
    local_458 = in_XMM3_Qa;
    local_448 = in_XMM4_Qa;
    local_438 = in_XMM5_Qa;
    local_428 = in_XMM6_Qa;
    local_418 = in_XMM7_Qa;
  }
  if ((level < 4) || (sys_verbose != 0)) {
    local_4c8 = local_4b8;
    local_4d0 = &ap[0].overflow_arg_area;
    local_4d8 = 0x3000000018;
    local_4a0 = in_RCX;
    local_498 = in_R8;
    local_490 = in_R9;
    vsnprintf(local_408,999,fmt,&local_4d8);
    sVar1 = strlen(local_408);
    (local_408 + sVar1)[0] = '\n';
    (local_408 + sVar1)[1] = '\0';
    dologpost(object,level,local_408);
  }
  return;
}

Assistant:

void logpost(const void *object, int level, const char *fmt, ...)
{
    char buf[MAXPDSTRING];
    va_list ap;
    if (level > PD_DEBUG && !sys_verbose) return;
    va_start(ap, fmt);
    vsnprintf(buf, MAXPDSTRING-1, fmt, ap);
    va_end(ap);
    strcat(buf, "\n");

    dologpost(object, level, buf);
}